

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

uint8_t equal_docs(fdb_doc *doc,docio_object *_doc)

{
  int iVar1;
  
  if (doc->seqnum == 0xffffffffffffffff) {
    if ((doc->key == (void *)0x0) || (iVar1 = bcmp(doc->key,_doc->key,doc->keylen), iVar1 == 0)) {
      if (doc->meta == (void *)0x0) {
        return '\x01';
      }
      iVar1 = bcmp(doc->meta,_doc->meta,doc->metalen);
      if (iVar1 == 0) {
        return '\x01';
      }
    }
  }
  else if (doc->seqnum == (_doc->field_3).seqnum) {
    return '\x01';
  }
  free(_doc->key);
  free(_doc->meta);
  free(_doc->body);
  _doc->key = (void *)0x0;
  _doc->meta = (void *)0x0;
  _doc->body = (void *)0x0;
  return '\0';
}

Assistant:

static uint8_t equal_docs(fdb_doc *doc, struct docio_object *_doc) {
    uint8_t rv = 1;
    // Compare a seq num if seq tree is enabled.
    if (doc->seqnum != SEQNUM_NOT_USED) {
        if (doc->seqnum != _doc->seqnum) {
            free(_doc->key);
            free(_doc->meta);
            free(_doc->body);
            _doc->key = _doc->meta = _doc->body = NULL;
            rv = 0;
        }
    } else { // Compare key and metadata
        if ((doc->key && memcmp(doc->key, _doc->key, doc->keylen)) ||
            (doc->meta && memcmp(doc->meta, _doc->meta, doc->metalen))) {
            free(_doc->key);
            free(_doc->meta);
            free(_doc->body);
            _doc->key = _doc->meta = _doc->body = NULL;
            rv = 0;
        }
    }
    return rv;
}